

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_writeFrameHeader
                 (void *dst,size_t dstCapacity,ZSTD_CCtx_params *params,U64 pledgedSrcSize,
                 U32 dictID)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char cVar5;
  void *memPtr;
  ulong in_RCX;
  int *in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint in_R8D;
  bool bVar6;
  size_t pos;
  BYTE frameHeaderDescriptionByte;
  U32 fcsCode;
  BYTE windowLogByte;
  U32 singleSegment;
  U32 windowSize;
  U32 checksumFlag;
  U32 dictIDSizeCode;
  U32 dictIDSizeCodeLength;
  BYTE *op;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  U16 in_stack_ffffffffffffff7e;
  void *in_stack_ffffffffffffff80;
  uint local_6c;
  bool local_65;
  size_t local_60;
  size_t local_8;
  
  cVar5 = (in_R8D != 0) + (0xff < in_R8D) + (0xffff < in_R8D);
  if (in_RDX[10] != 0) {
    cVar5 = '\0';
  }
  iVar1 = in_RDX[9];
  iVar2 = in_RDX[8];
  bVar6 = in_RCX <= (uint)(1 << ((byte)in_RDX[1] & 0x1f));
  local_65 = iVar2 != 0 && bVar6;
  iVar3 = in_RDX[1];
  if (in_RDX[8] == 0) {
    local_6c = 0;
  }
  else {
    local_6c = (uint)(0xff < in_RCX) + (uint)(0x100ff < in_RCX) + (uint)(0xfffffffe < in_RCX);
  }
  local_60 = 0;
  if ((in_RDX[8] != 0) && (in_RCX == 0xffffffffffffffff)) {
    __assert_fail("!(params->fParams.contentSizeFlag && pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6240,
                  "size_t ZSTD_writeFrameHeader(void *, size_t, const ZSTD_CCtx_params *, U64, U32)"
                 );
  }
  if (in_RSI < 0x12) {
    local_8 = 0xffffffffffffffba;
  }
  else {
    if (*in_RDX == 0) {
      MEM_writeLE32(in_stack_ffffffffffffff80,
                    CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
      local_60 = 4;
    }
    *(char *)(in_RDI + local_60) =
         cVar5 + (0 < iVar1) * '\x04' + local_65 * ' ' + (char)(local_6c << 6);
    sVar4 = local_60 + 1;
    if (iVar2 == 0 || !bVar6) {
      *(char *)(in_RDI + local_60 + 1) = ((char)iVar3 + -10) * '\b';
      sVar4 = local_60 + 2;
    }
    local_60 = sVar4;
    switch(cVar5) {
    case '\0':
      break;
    case '\x01':
      *(char *)(in_RDI + local_60) = (char)in_R8D;
      local_60 = local_60 + 1;
      break;
    case '\x02':
      MEM_writeLE16(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
      local_60 = local_60 + 2;
      break;
    case '\x03':
      MEM_writeLE32(in_stack_ffffffffffffff80,
                    CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
      local_60 = local_60 + 4;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x624e,
                    "size_t ZSTD_writeFrameHeader(void *, size_t, const ZSTD_CCtx_params *, U64, U32)"
                   );
    }
    memPtr = (void *)(ulong)local_6c;
    switch(memPtr) {
    case (void *)0x0:
      if (local_65) {
        *(char *)(in_RDI + local_60) = (char)in_RCX;
        local_60 = local_60 + 1;
      }
      break;
    case (void *)0x1:
      MEM_writeLE16(memPtr,in_stack_ffffffffffffff7e);
      local_60 = local_60 + 2;
      break;
    case (void *)0x2:
      MEM_writeLE32(memPtr,CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
      local_60 = local_60 + 4;
      break;
    case (void *)0x3:
      MEM_writeLE64(memPtr,CONCAT26(in_stack_ffffffffffffff7e,
                                    CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
      local_60 = local_60 + 8;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6258,
                    "size_t ZSTD_writeFrameHeader(void *, size_t, const ZSTD_CCtx_params *, U64, U32)"
                   );
    }
    local_8 = local_60;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_writeFrameHeader(void* dst, size_t dstCapacity,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize, U32 dictID)
{   BYTE* const op = (BYTE*)dst;
    U32   const dictIDSizeCodeLength = (dictID>0) + (dictID>=256) + (dictID>=65536);   /* 0-3 */
    U32   const dictIDSizeCode = params->fParams.noDictIDFlag ? 0 : dictIDSizeCodeLength;   /* 0-3 */
    U32   const checksumFlag = params->fParams.checksumFlag>0;
    U32   const windowSize = (U32)1 << params->cParams.windowLog;
    U32   const singleSegment = params->fParams.contentSizeFlag && (windowSize >= pledgedSrcSize);
    BYTE  const windowLogByte = (BYTE)((params->cParams.windowLog - ZSTD_WINDOWLOG_ABSOLUTEMIN) << 3);
    U32   const fcsCode = params->fParams.contentSizeFlag ?
                     (pledgedSrcSize>=256) + (pledgedSrcSize>=65536+256) + (pledgedSrcSize>=0xFFFFFFFFU) : 0;  /* 0-3 */
    BYTE  const frameHeaderDescriptionByte = (BYTE)(dictIDSizeCode + (checksumFlag<<2) + (singleSegment<<5) + (fcsCode<<6) );
    size_t pos=0;

    assert(!(params->fParams.contentSizeFlag && pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN));
    RETURN_ERROR_IF(dstCapacity < ZSTD_FRAMEHEADERSIZE_MAX, dstSize_tooSmall,
                    "dst buf is too small to fit worst-case frame header size.");
    DEBUGLOG(4, "ZSTD_writeFrameHeader : dictIDFlag : %u ; dictID : %u ; dictIDSizeCode : %u",
                !params->fParams.noDictIDFlag, (unsigned)dictID, (unsigned)dictIDSizeCode);
    if (params->format == ZSTD_f_zstd1) {
        MEM_writeLE32(dst, ZSTD_MAGICNUMBER);
        pos = 4;
    }
    op[pos++] = frameHeaderDescriptionByte;
    if (!singleSegment) op[pos++] = windowLogByte;
    switch(dictIDSizeCode)
    {
        default:
            assert(0); /* impossible */
            ZSTD_FALLTHROUGH;
        case 0 : break;
        case 1 : op[pos] = (BYTE)(dictID); pos++; break;
        case 2 : MEM_writeLE16(op+pos, (U16)dictID); pos+=2; break;
        case 3 : MEM_writeLE32(op+pos, dictID); pos+=4; break;
    }
    switch(fcsCode)
    {
        default:
            assert(0); /* impossible */
            ZSTD_FALLTHROUGH;
        case 0 : if (singleSegment) op[pos++] = (BYTE)(pledgedSrcSize); break;
        case 1 : MEM_writeLE16(op+pos, (U16)(pledgedSrcSize-256)); pos+=2; break;
        case 2 : MEM_writeLE32(op+pos, (U32)(pledgedSrcSize)); pos+=4; break;
        case 3 : MEM_writeLE64(op+pos, (U64)(pledgedSrcSize)); pos+=8; break;
    }
    return pos;
}